

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.h
# Opt level: O2

void __thiscall clean_up_fixture::~clean_up_fixture(clean_up_fixture *this)

{
  bool bVar1;
  
  bVar1 = boost::filesystem::exists(&this->m_path);
  if (bVar1) {
    boost::filesystem::remove_all(&this->m_path);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~clean_up_fixture()
    {
        if(exists())
        {
            try
            {
                fs::remove_all(m_path);
            }
            catch (...) {
            }
        }
    }